

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_opcode(sexp ctx,sexp self,sexp name,sexp op_class,sexp code,sexp num_args,sexp flags,
                     sexp arg1t,sexp arg2t,sexp invp,sexp data,sexp data2,sexp_proc1 func)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  sexp in_RCX;
  sexp in_RDX;
  long in_RDI;
  sexp in_R8;
  sexp in_R9;
  sexp res;
  sexp_uint_t in_stack_ffffffffffffffc0;
  sexp local_8;
  
  if (((ulong)in_R9 & 1) == 1) {
    if (((ulong)res & 1) == 1) {
      if (((((ulong)in_RCX & 1) == 1) &&
          (auVar1._8_8_ = (long)in_RCX >> 0x3f, auVar1._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe,
          0 < SUB168(auVar1 / SEXT816(2),0))) &&
         (auVar2._8_8_ = (long)in_RCX >> 0x3f, auVar2._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe,
         SUB168(auVar2 / SEXT816(2),0) < 0xc)) {
        if (((((ulong)in_R8 & 1) == 1) &&
            (auVar3._8_8_ = (long)in_R8 >> 0x3f, auVar3._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe,
            0 < SUB168(auVar3 / SEXT816(2),0))) &&
           (auVar4._8_8_ = (long)in_R8 >> 0x3f, auVar4._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe,
           SUB168(auVar4 / SEXT816(2),0) < 0x54)) {
          local_8 = sexp_alloc_tagged_aux(in_R8,(size_t)in_R9,in_stack_ffffffffffffffc0);
          auVar5._8_8_ = (long)in_RCX >> 0x3f;
          auVar5._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
          (local_8->value).flonum_bits[0x58] = SUB161(auVar5 / SEXT816(2),0);
          auVar6._8_8_ = (long)in_R8 >> 0x3f;
          auVar6._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
          (local_8->value).flonum_bits[0x59] = SUB161(auVar6 / SEXT816(2),0);
          auVar7._8_8_ = (long)in_R9 >> 0x3f;
          auVar7._0_8_ = (ulong)in_R9 & 0xfffffffffffffffe;
          (local_8->value).flonum_bits[0x5a] = SUB161(auVar7 / SEXT816(2),0);
          auVar8._8_8_ = (long)res >> 0x3f;
          auVar8._0_8_ = (ulong)res & 0xfffffffffffffffe;
          (local_8->value).flonum_bits[0x5b] = SUB161(auVar8 / SEXT816(2),0);
          (local_8->value).type.id = num_args;
          (local_8->value).type.print = code;
          auVar9._8_8_ = (long)op_class >> 0x3f;
          auVar9._0_8_ = (ulong)op_class & 0xfffffffffffffffe;
          (local_8->value).flonum_bits[0x5c] = SUB161(auVar9 / SEXT816(2),0);
          (local_8->value).type.cpl = name;
          (local_8->value).type.slots = self;
          (local_8->value).context.dl = ctx;
          (local_8->value).type.name = in_RDX;
          (local_8->value).opcode.dl = *(sexp *)(in_RDI + 0x68);
        }
        else {
          local_8 = sexp_xtype_exception(in_RDX,in_RCX,(char *)in_R8,in_R9);
        }
      }
      else {
        local_8 = sexp_xtype_exception(in_RDX,in_RCX,(char *)in_R8,in_R9);
      }
    }
    else {
      local_8 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,in_R9);
    }
  }
  else {
    local_8 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,in_R9);
  }
  return local_8;
}

Assistant:

sexp sexp_make_opcode (sexp ctx, sexp self, sexp name, sexp op_class, sexp code,
                       sexp num_args, sexp flags, sexp arg1t, sexp arg2t,
                       sexp invp, sexp data, sexp data2, sexp_proc1 func) {
  sexp res;
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, num_args);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, flags);
  if ((! sexp_fixnump(op_class)) || (sexp_unbox_fixnum(op_class) <= 0)
      || (sexp_unbox_fixnum(op_class) >= SEXP_OPC_NUM_OP_CLASSES))
    res = sexp_xtype_exception(ctx, self, "make-opcode: bad opcode class", op_class);
  else if ((! sexp_fixnump(code)) || (sexp_unbox_fixnum(code) <= 0)
      || (sexp_unbox_fixnum(code) >= SEXP_OP_NUM_OPCODES))
    res = sexp_xtype_exception(ctx, self, "make-opcode: bad opcode", code);
  else {
    res = sexp_alloc_type(ctx, opcode, SEXP_OPCODE);
    sexp_opcode_class(res) = (unsigned char)sexp_unbox_fixnum(op_class);
    sexp_opcode_code(res) = (unsigned char)sexp_unbox_fixnum(code);
    sexp_opcode_num_args(res) = (unsigned char)sexp_unbox_fixnum(num_args);
    sexp_opcode_flags(res) = (unsigned char)sexp_unbox_fixnum(flags);
    sexp_opcode_arg1_type(res) = arg1t;
    sexp_opcode_arg2_type(res) = arg2t;
    sexp_opcode_inverse(res) = (unsigned char)sexp_unbox_fixnum(invp);
    sexp_opcode_data(res) = data;
    sexp_opcode_data2(res) = data2;
    sexp_opcode_func(res) = func;
    sexp_opcode_name(res) = name;
#if SEXP_USE_DL
    sexp_opcode_dl(res) = sexp_context_dl(ctx);
#endif
  }
  return res;
}